

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  uint *puVar6;
  slot_type *psVar7;
  ulong uVar8;
  size_t hash;
  size_t extraout_RDX;
  size_t hash_00;
  byte bVar9;
  size_t sVar10;
  ctrl_t cVar11;
  ulong uVar12;
  bool bVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (sVar1 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *)common);
    bVar13 = 1 < common->size_;
  }
  else {
    bVar13 = false;
  }
  bVar9 = 0x80;
  if (bVar13 != false) {
    puVar6 = (uint *)soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                               *)common);
    bVar9 = (byte)(((ulong)*puVar6 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                   0x5cb22ca68cb134ed >> 0x38) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_36 = bVar13;
  CommonFields::set_capacity(common,new_capacity);
  bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_51,(int)(char)bVar9,4,4);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if ((bVar13 | sVar1 != 1) == 1) {
    psVar7 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)common);
    uVar4 = local_50.heap.slot_array;
    if (!bVar5) {
      if (sVar1 == 1) {
        uVar12 = ((ulong)local_50.heap.control & 0xffffffff ^
                 (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
        FVar14 = find_first_non_full<void>
                           ((container_internal *)common,
                            (CommonFields *)
                            (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                             (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash);
        uVar8 = FVar14.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar8) {
LAB_001f15b6:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar8] = cVar11;
        pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar8 - 0xf & uVar2)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        psVar7[uVar8] = local_50._0_4_;
        CommonFields::set_capacity(common,uVar2);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar10 = 0;
          hash_00 = hash;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar10]) {
              uVar12 = ((ulong)*(uint *)(uVar4 + sVar10 * 4) ^
                       (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
              FVar14 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash_00);
              uVar8 = FVar14.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar8) goto LAB_001f15b6;
              cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar8] = cVar11;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar8 - 0xf & uVar2)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              psVar7[uVar8] = *(slot_type *)(uVar4 + sVar10 * 4);
              CommonFields::set_capacity(common,uVar2);
              hash_00 = extraout_RDX;
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<4ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_52,4);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }